

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O2

void executor_corun_1(uint W)

{
  FlowBuilder FVar1;
  long lVar2;
  bool bVar3;
  Future<void> local_328;
  shared_ptr<tf::WorkerInterface> local_308;
  Taskflow taskflow2;
  Taskflow taskflow1;
  Executor executor;
  
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_308);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_308.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow1);
  tf::Taskflow::Taskflow(&taskflow2);
  FVar1 = taskflow1.super_FlowBuilder;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_328.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_328.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_328.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_328.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:709:21)>
       ::_M_invoke;
  *(code **)&local_328.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:709:21)>
       ::_M_manager;
  *(undefined1 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  FVar1 = taskflow2.super_FlowBuilder;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_328.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_328.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_328.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_328.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)&executor;
  *(Taskflow **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_status = &taskflow1;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:713:21)>
       ::_M_invoke;
  *(code **)&local_328.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:713:21)>
       ::_M_manager;
  *(undefined1 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  tf::Executor::run(&local_328,&executor,&taskflow2);
  std::future<void>::get(&local_328.super_future<void>);
  tf::Future<void>::~Future(&local_328);
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::clear(&taskflow1._graph.
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         );
  std::
  vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
  ::clear(&taskflow2._graph.
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
         );
  lVar2 = 100;
  while (FVar1._graph = taskflow1.super_FlowBuilder._graph, bVar3 = lVar2 != 0, lVar2 = lVar2 + -1,
        bVar3) {
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    (local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr__State_baseV2 = (_func_int **)0x0;
    ((local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)
         &(local_328.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_M_once;
    (local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_status = (atomic<unsigned_int>)0x0;
    (local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &(local_328.super_future<void>.super___basic_future<void>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      field_0x15 = 0;
    *(undefined1 *)
     &((local_328.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_once)._M_once = 0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_status = (atomic<unsigned_int>)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      field_0x15 = 0;
    *(undefined8 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      _M_once = 0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _vptr__State_baseV2 = (_func_int **)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)
         (local_328.super_future<void>.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
         3);
    *(element_type **)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
      _M_status = local_328.super_future<void>.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 3;
    *(element_type **)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
      _M_once = local_328.super_future<void>.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr + 4;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _vptr__State_baseV2 = (_func_int **)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_status = (atomic<unsigned_int>)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
      field_0x15 = 0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
    _vptr__State_baseV2 =
         (_func_int **)
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:723:23)>
         ::_M_invoke;
    *(code **)&local_328.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr[4]._M_once =
         std::
         _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:723:23)>
         ::_M_manager;
    *(undefined8 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
      _M_once = 0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
    _M_status = (atomic<unsigned_int>)0x0;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
      field_0x15 = 0;
    *(undefined1 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
      _vptr__State_baseV2 = 3;
    local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    *(undefined8 *)
     &local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
      _M_status._M_data = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar1._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  }
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_328.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_328.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_328.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_328.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_328.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_328.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_328.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)&executor;
  *(Taskflow **)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_status = &taskflow1;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:732:21)>
       ::_M_invoke;
  *(code **)&local_328.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:732:21)>
       ::_M_manager;
  *(undefined1 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 1;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_328.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_328.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow2.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_328);
  tf::Executor::run(&local_328,&executor,&taskflow2);
  std::future<void>::get(&local_328.super_future<void>);
  tf::Future<void>::~Future(&local_328);
  tf::Taskflow::~Taskflow(&taskflow2);
  tf::Taskflow::~Taskflow(&taskflow1);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void executor_corun_1(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow1;
  tf::Taskflow taskflow2;

  taskflow1.emplace([](){
    throw std::runtime_error("x");
  });

  taskflow2.emplace([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow1), "x", std::runtime_error);
  });

  executor.run(taskflow2).get();
  
  taskflow1.clear();
  taskflow2.clear();

  for(size_t i=0; i<100; i++) {
    taskflow1.emplace([](tf::Subflow& sf){
      for(size_t j=0; j<100; j++) {
        sf.emplace([&](){
          throw std::runtime_error("y");
        });
      }
    });
  }
  
  taskflow2.emplace([&](){
    REQUIRE_THROWS_WITH_AS(executor.corun(taskflow1), "y", std::runtime_error);
  });

  executor.run(taskflow2).get();
}